

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

ssize_t nw_in_recv(void *reader_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  CURLcode CVar1;
  void *local_40;
  size_t nread;
  Curl_easy *data;
  CURLcode *err_local;
  size_t buflen_local;
  uchar *buf_local;
  void *reader_ctx_local;
  
  nread = (size_t)reader_ctx;
  data = (Curl_easy *)err;
  err_local = (CURLcode *)buflen;
  buflen_local = (size_t)buf;
  buf_local = (uchar *)reader_ctx;
  CVar1 = curl_easy_recv((Curl_easy *)reader_ctx,buf,buflen,(size_t *)&local_40);
  data->magic = CVar1;
  if (data->magic == 0) {
    reader_ctx_local = local_40;
  }
  else {
    reader_ctx_local = (void *)0xffffffffffffffff;
  }
  return (ssize_t)reader_ctx_local;
}

Assistant:

static ssize_t nw_in_recv(void *reader_ctx,
                          unsigned char *buf, size_t buflen,
                          CURLcode *err)
{
  struct Curl_easy *data = reader_ctx;
  size_t nread;

  *err = curl_easy_recv(data, buf, buflen, &nread);
  if(*err)
    return -1;
  return (ssize_t)nread;
}